

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O0

char * cashew::JSPrinter::numToString(double d,bool finalize)

{
  char cVar1;
  char *pcVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  char *pcVar7;
  size_t sVar8;
  size_t sVar9;
  undefined1 auVar10 [16];
  char *local_100;
  char *local_f8;
  double *local_e0;
  byte local_cd;
  undefined1 local_cb;
  char local_c9;
  char *local_c8;
  char *local_c0;
  char *ret;
  char *pcStack_b0;
  int num;
  char *test;
  char *end_1;
  char *copy_1;
  char *copy;
  char *end;
  char *dot;
  unsigned_long_long tempULL;
  uint64_t uStack_70;
  bool asHex;
  unsigned_long_long uu;
  char local_5e [2];
  int i;
  double dStack_58;
  char format [6];
  double temp;
  char *buffer;
  double dStack_40;
  int e;
  double err_e;
  double err_f;
  char *storage_e;
  char *storage_f;
  bool integer;
  bool neg;
  double dStack_18;
  bool finalize_local;
  double d_local;
  
  storage_f._7_1_ = finalize;
  dStack_18 = d;
  uVar4 = std::isnan(d);
  if ((uVar4 & 1) == 0) {
    bVar3 = std::isfinite(dStack_18);
    if (bVar3) {
      storage_f._6_1_ = dStack_18 < 0.0;
      if ((bool)storage_f._6_1_) {
        dStack_18 = -dStack_18;
      }
      storage_f._5_1_ = ::wasm::isInteger(dStack_18);
      lVar6 = __tls_get_addr(&PTR_030b9288);
      storage_e = (char *)(lVar6 + 1);
      lVar6 = __tls_get_addr(&PTR_030ba100);
      err_f = (double)(lVar6 + 1);
      err_e = std::numeric_limits<double>::quiet_NaN();
      dStack_40 = std::numeric_limits<double>::quiet_NaN();
      for (buffer._4_4_ = 0; buffer._4_4_ < 2; buffer._4_4_ = buffer._4_4_ + 1) {
        if (buffer._4_4_ == 0) {
          local_c8 = storage_e;
        }
        else {
          local_c8 = (char *)err_f;
        }
        if ((storage_f._5_1_ & 1) == 0) {
          for (uu._4_4_ = 0; uu._4_4_ < 0x13; uu._4_4_ = uu._4_4_ + 1) {
            local_5e[0] = '%';
            local_5e[1] = 0x2e;
            if (uu._4_4_ < 10) {
              i._0_1_ = (char)uu._4_4_ + '0';
              local_c9 = 'e';
              if (buffer._4_4_ == 0) {
                local_c9 = 'f';
              }
              i._1_1_ = local_c9;
              i._2_1_ = 0;
            }
            else {
              i._0_1_ = '1';
              i._1_1_ = (char)uu._4_4_ + '&';
              local_cb = 0x65;
              if (buffer._4_4_ == 0) {
                local_cb = 0x66;
              }
              i._2_1_ = local_cb;
              i._3_1_ = 0;
            }
            snprintf(local_c8,999,local_5e,dStack_18);
            __isoc99_sscanf(local_c8,"%lf",&stack0xffffffffffffffa8);
            if ((dStack_58 == dStack_18) && (!NAN(dStack_58) && !NAN(dStack_18))) break;
          }
        }
        else {
          if (dStack_18 < 0.0) {
            __assert_fail("d >= 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/emscripten-optimizer/simple_ast.h"
                          ,0x3d2,"static char *cashew::JSPrinter::numToString(double, bool)");
          }
          bVar3 = ::wasm::isUInteger64(dStack_18);
          if (bVar3) {
            uStack_70 = ::wasm::toUInteger64(dStack_18);
            local_cd = 0;
            if (buffer._4_4_ != 0) {
              local_cd = storage_f._7_1_ ^ 0xff;
            }
            tempULL._7_1_ = local_cd & 1;
            pcVar7 = "%llu";
            if (tempULL._7_1_ != 0) {
              pcVar7 = "0x%llx";
            }
            snprintf(local_c8,999,pcVar7,uStack_70);
            if ((tempULL._7_1_ & 1) == 0) {
              __isoc99_sscanf(local_c8,"%lf",&stack0xffffffffffffffa8);
            }
            else {
              __isoc99_sscanf(local_c8,"%llx",&dot);
              auVar10._8_4_ = (int)((ulong)dot >> 0x20);
              auVar10._0_8_ = dot;
              auVar10._12_4_ = 0x45300000;
              dStack_58 = (auVar10._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,(int)dot) - 4503599627370496.0);
            }
          }
          else {
            pcVar7 = "%.0f";
            if (buffer._4_4_ != 0) {
              pcVar7 = "%e";
            }
            snprintf(local_c8,999,pcVar7,dStack_18);
            __isoc99_sscanf(local_c8,"%lf",&stack0xffffffffffffffa8);
          }
        }
        if (buffer._4_4_ == 0) {
          local_e0 = &err_e;
        }
        else {
          local_e0 = &stack0xffffffffffffffc0;
        }
        *local_e0 = ABS(dStack_58 - dStack_18);
        pcVar7 = strchr(local_c8,0x2e);
        if (pcVar7 == (char *)0x0) {
          if (((storage_f._5_1_ & 1) == 0) || (buffer._4_4_ == 0)) {
            pcVar7 = strchr(local_c8,0);
            pcStack_b0 = pcVar7 + -1;
            while( true ) {
              if ((*pcStack_b0 == '0') || (bVar3 = false, 0x18 < (long)pcStack_b0 - (long)local_c8))
              {
                bVar3 = local_c8 < pcStack_b0;
              }
              if (!bVar3) break;
              pcStack_b0 = pcStack_b0 + -1;
            }
            iVar5 = (int)(pcVar7 + -1) - (int)pcStack_b0;
            if (2 < iVar5) {
              pcStack_b0[1] = 'e';
              if (iVar5 < 10) {
                pcStack_b0[2] = (char)iVar5 + '0';
                pcStack_b0[3] = '\0';
              }
              else if (iVar5 < 100) {
                pcStack_b0[2] = (char)(iVar5 / 10) + '0';
                pcStack_b0[3] = (char)(iVar5 % 10) + '0';
                pcStack_b0[4] = '\0';
              }
              else {
                if (999 < iVar5) {
                  __assert_fail("num < 1000",
                                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/emscripten-optimizer/simple_ast.h"
                                ,0x418,"static char *cashew::JSPrinter::numToString(double, bool)");
                }
                pcStack_b0[2] = (char)(iVar5 / 100) + '0';
                pcStack_b0[3] =
                     (char)((long)((ulong)(uint)((int)((long)iVar5 % 100) >> 0x1f) << 0x20 |
                                  (long)iVar5 % 100 & 0xffffffffU) / 10) + '0';
                pcStack_b0[4] = (char)(iVar5 % 10) + '0';
                pcStack_b0[5] = '\0';
              }
            }
          }
        }
        else {
          do {
            copy = pcVar7 + 1;
            bVar3 = false;
            if ('/' < *copy) {
              bVar3 = *copy < ':';
            }
            pcVar2 = pcVar7;
            pcVar7 = copy;
          } while (bVar3);
          while (copy = pcVar2, *copy == '0') {
            copy_1 = copy;
            do {
              *copy_1 = copy_1[1];
              cVar1 = *copy_1;
              copy_1 = copy_1 + 1;
            } while (cVar1 != '\0');
            pcVar2 = copy + -1;
          }
          while (*local_c8 == '0') {
            end_1 = local_c8;
            do {
              *end_1 = end_1[1];
              cVar1 = *end_1;
              end_1 = end_1 + 1;
            } while (cVar1 != '\0');
          }
        }
      }
      if ((dStack_40 != err_e) || (NAN(dStack_40) || NAN(err_e))) {
        if (err_e <= dStack_40) {
          local_100 = storage_e;
        }
        else {
          local_100 = (char *)err_f;
        }
        local_c0 = local_100;
      }
      else {
        sVar8 = strlen((char *)err_f);
        sVar9 = strlen(storage_e);
        if (sVar8 < sVar9) {
          local_f8 = (char *)err_f;
        }
        else {
          local_f8 = storage_e;
        }
        local_c0 = local_f8;
      }
      if ((storage_f._6_1_ & 1) != 0) {
        local_c0 = local_c0 + -1;
        *local_c0 = '-';
      }
      d_local = (double)local_c0;
    }
    else {
      bVar3 = std::signbit(dStack_18);
      if (bVar3) {
        d_local = (double)anon_var_dwarf_2e08e2f;
      }
      else {
        d_local = (double)((long)"-Infinity" + 1);
      }
    }
  }
  else {
    bVar3 = std::signbit(dStack_18);
    if (bVar3) {
      d_local = (double)anon_var_dwarf_2e08e17;
    }
    else {
      d_local = (double)((long)"expected a NaN" + 0xb);
    }
  }
  return (char *)d_local;
}

Assistant:

static char* numToString(double d, bool finalize = true) {
    if (std::isnan(d)) {
      if (std::signbit(d)) {
        return (char*)"-NaN";
      } else {
        return (char*)"NaN";
      }
    } else if (!std::isfinite(d)) {
      if (std::signbit(d)) {
        return (char*)"-Infinity";
      } else {
        return (char*)"Infinity";
      }
    }
    bool neg = d < 0;
    if (neg) {
      d = -d;
    }
    // try to emit the fewest necessary characters
    bool integer = wasm::isInteger(d);
#define BUFFERSIZE 1000
    // f is normal, e is scientific for float, x for integer
    // These need to be thread-local because they are returned.
    thread_local char full_storage_f[BUFFERSIZE];
    thread_local char full_storage_e[BUFFERSIZE];
    // full has one more char, for a possible '-'
    char* storage_f = full_storage_f + 1;
    char* storage_e = full_storage_e + 1;
    auto err_f = std::numeric_limits<double>::quiet_NaN();
    auto err_e = std::numeric_limits<double>::quiet_NaN();
    for (int e = 0; e <= 1; e++) {
      char* buffer = e ? storage_e : storage_f;
      double temp;
      if (!integer) {
        char format[6];
        for (int i = 0; i <= 18; i++) {
          format[0] = '%';
          format[1] = '.';
          if (i < 10) {
            format[2] = '0' + i;
            format[3] = e ? 'e' : 'f';
            format[4] = 0;
          } else {
            format[2] = '1';
            format[3] = '0' + (i - 10);
            format[4] = e ? 'e' : 'f';
            format[5] = 0;
          }
          snprintf(buffer, BUFFERSIZE - 1, format, d);
          sscanf(buffer, "%lf", &temp);
          // errv("%.18f, %.18e   =>   %s   =>   %.18f, %.18e   (%d), ", d, d,
          // buffer, temp, temp, temp == d);
          if (temp == d) {
            break;
          }
        }
      } else {
        // integer
        assert(d >= 0);
        if (wasm::isUInteger64(d)) {
          unsigned long long uu = wasm::toUInteger64(d);
          bool asHex = e && !finalize;
          snprintf(buffer, BUFFERSIZE - 1, asHex ? "0x%llx" : "%llu", uu);
          if (asHex) {
            unsigned long long tempULL;
            sscanf(buffer, "%llx", &tempULL);
            temp = (double)tempULL;
          } else {
            sscanf(buffer, "%lf", &temp);
          }
        } else {
          // too large for a machine integer, just use floats
          // even on integers, e with a dot is useful, e.g. 1.2e+200
          snprintf(buffer, BUFFERSIZE - 1, e ? "%e" : "%.0f", d);
          sscanf(buffer, "%lf", &temp);
        }
        // errv("%.18f, %.18e   =>   %s   =>   %.18f, %.18e, %llu   (%d)\n", d,
        //      d, buffer, temp, temp, uu, temp == d);
      }
      (e ? err_e : err_f) = fabs(temp - d);
      // errv("current attempt: %.18f  =>  %s", d, buffer);
      // assert(temp == d);
      char* dot = strchr(buffer, '.');
      if (dot) {
        // remove trailing zeros
        char* end = dot + 1;
        while (*end >= '0' && *end <= '9') {
          end++;
        }
        end--;
        while (*end == '0') {
          char* copy = end;
          do {
            copy[0] = copy[1];
          } while (*copy++ != 0);
          end--;
        }
        // errv("%.18f  =>   %s", d, buffer);
        // remove preceding zeros
        while (*buffer == '0') {
          char* copy = buffer;
          do {
            copy[0] = copy[1];
          } while (*copy++ != 0);
        }
        // errv("%.18f ===>  %s", d, buffer);
      } else if (!integer || !e) {
        // no dot. try to change 12345000 => 12345e3
        char* end = strchr(buffer, 0);
        end--;
        char* test = end;
        // remove zeros, and also doubles can use at most 24 digits, we can
        // truncate any extras even if not zero
        while ((*test == '0' || test - buffer > 24) && test > buffer) {
          test--;
        }
        int num = end - test;
        if (num >= 3) {
          test++;
          test[0] = 'e';
          if (num < 10) {
            test[1] = '0' + num;
            test[2] = 0;
          } else if (num < 100) {
            test[1] = '0' + (num / 10);
            test[2] = '0' + (num % 10);
            test[3] = 0;
          } else {
            assert(num < 1000);
            test[1] = '0' + (num / 100);
            test[2] = '0' + (num % 100) / 10;
            test[3] = '0' + (num % 10);
            test[4] = 0;
          }
        }
      }
      // errv("..current attempt: %.18f  =>  %s", d, buffer);
    }
    // fprintf(stderr, "options:\n%s\n%s\n (first? %d)\n", storage_e, storage_f,
    //         strlen(storage_e) < strlen(storage_f));
    char* ret;
    if (err_e == err_f) {
      ret = strlen(storage_e) < strlen(storage_f) ? storage_e : storage_f;
    } else {
      ret = err_e < err_f ? storage_e : storage_f;
    }
    if (neg) {
      ret--; // safe to go back one, there is one more char in full_*
      *ret = '-';
    }
    return ret;
  }